

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Translator_X86.cpp
# Opt level: O2

int TestRegNum64Encoding
              (CodeGenGenericContext *ctx,uchar *stream,x86Command op,
              _func_int_uchar_ptr_x86Reg_unsigned_long_long *fun)

{
  x86Reg reg1;
  int iVar1;
  uchar *puVar2;
  long lVar3;
  int local_40;
  
  puVar2 = stream;
  for (lVar3 = 0; lVar3 != 0x24; lVar3 = lVar3 + 4) {
    reg1 = *(x86Reg *)((long)testRegs + lVar3);
    EMIT_OP_REG_NUM64(ctx,op,reg1,0x1122aabbccddeeff);
    iVar1 = (*fun)(puVar2,reg1,0x1122aabbccddeeff);
    puVar2 = puVar2 + iVar1;
  }
  local_40 = (int)stream;
  return (int)puVar2 - local_40;
}

Assistant:

int TestRegNum64Encoding(CodeGenGenericContext &ctx, unsigned char *stream, x86Command op, int (*fun)(unsigned char *stream, x86Reg dst, unsigned long long num))
{
	unsigned char *start = stream;

	for(unsigned reg = 0; reg < sizeof(testRegs) / sizeof(testRegs[0]); reg++)
	{
		EMIT_OP_REG_NUM64(ctx, op, testRegs[reg], 0x1122aabbccddeeffll);
		stream += fun(stream, testRegs[reg], 0x1122aabbccddeeffll);
	}

	return int(stream - start);
}